

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O1

int __thiscall cali::ConfigSetImpl::init(ConfigSetImpl *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  const_iterator cVar4;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined4 in_ECX;
  long *in_RDX;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  string varname;
  string value;
  allocator<char> local_111;
  undefined1 local_110 [36];
  undefined4 local_ec;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_e0;
  EVP_PKEY_CTX *local_d8;
  string local_d0;
  long *local_b0;
  char *local_a8;
  long local_a0 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
  local_90;
  _Base_ptr local_50;
  _Base_ptr local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::StringConverter>,std::allocator<std::pair<std::__cxx11::string_const,cali::StringConverter>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_38;
  
  key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RDX;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX[1];
  if (key != pbVar5) {
    local_48 = &(in_R9->_M_impl).super__Rb_tree_header._M_header;
    local_50 = &(in_R8->_M_impl).super__Rb_tree_header._M_header;
    local_ec = in_ECX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    local_d8 = ctx;
    local_40 = pbVar5;
    local_38 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::StringConverter>,std::allocator<std::pair<std::__cxx11::string_const,cali::StringConverter>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,(char *)local_d8,(allocator<char> *)&local_b0);
      anon_unknown.dwarf_324f7::config_var_name(&local_d0,&local_90.first,key);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
        operator_delete(local_90.first._M_dataplus._M_p,
                        local_90.first.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = key[1]._M_dataplus._M_p;
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + key[1]._M_string_length);
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_e0,&local_d0);
      if (cVar4._M_node == local_48) {
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(local_e8,&local_d0);
        if (cVar4._M_node != local_50) {
          std::__cxx11::string::_M_assign((string *)&local_b0);
        }
        if ((char)local_ec != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_110,(char *)local_d8,&local_111);
          anon_unknown.dwarf_324f7::config_var_name(&local_90.first,(string *)local_110,key);
          _Var3._M_p = local_90.first._M_dataplus._M_p;
          __s = getenv(local_90.first._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &local_90.first.field_2) {
            operator_delete(_Var3._M_p,local_90.first.field_2._M_allocated_capacity + 1);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          pcVar2 = local_a8;
          if (__s != (char *)0x0) {
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)&local_b0,0,pcVar2,(ulong)__s);
          }
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_b0);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_110,local_b0,local_a8 + (long)local_b0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
      ::pair<cali::StringConverter,_true>(&local_90,key,(StringConverter *)local_110);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::StringConverter>,std::allocator<std::pair<std::__cxx11::string_const,cali::StringConverter>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,cali::StringConverter>>(local_38,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.second.m_str._M_dataplus._M_p != &local_90.second.m_str.field_2) {
        operator_delete(local_90.second.m_str._M_dataplus._M_p,
                        local_90.second.m_str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
        operator_delete(local_90.first._M_dataplus._M_p,
                        local_90.first.field_2._M_allocated_capacity + 1);
      }
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_110 + 0x10);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110._0_8_ !=
          pbVar5) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        pbVar5 = extraout_RAX;
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
        pbVar5 = extraout_RAX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        pbVar5 = extraout_RAX_01;
      }
      key = key + 2;
    } while (key != local_40);
  }
  return (int)pbVar5;
}

Assistant:

void init(
        const char*                               name,
        const RuntimeConfig::config_entry_list_t& list,
        bool                                      read_env,
        const ::config_profile_t&                 profile,
        const ::config_profile_t&                 top_profile
    )
    {
        for (const auto& e : list) {
            std::string varname { ::config_var_name(name, e.first) };
            std::string value { e.second };

            // See if there is an entry in the top config profile
            auto topit = top_profile.find(varname);

            if (topit != top_profile.end()) {
                value = topit->second;
            } else {
                // See if there is an entry in the base config profile
                auto it = profile.find(varname);
                if (it != profile.end())
                    value = it->second;

                if (read_env) {
                    // See if there is a config variable set
                    char* val = getenv(::config_var_name(name, e.first).c_str());
                    if (val)
                        value = val;
                }
            }

            m_dict.emplace(make_pair(e.first, StringConverter(value)));
        }
    }